

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLinearSCC
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  undefined1 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RDX;
  long in_RSI;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int r;
  uint ri;
  uint vv;
  undefined7 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  CFG *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  CFG *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_30;
  uint local_2c;
  byte local_1;
  
  for (local_2c = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX), local_2c < sVar3;
      local_2c = local_2c + 1) {
    local_30 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RSI + 0x40),(ulong)local_2c);
      sVar3 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                        (pvVar4);
      if (sVar3 <= local_30) break;
      pvVar4 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RSI + 0x40),(ulong)local_2c);
      pvVar5 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
               operator[](pvVar4,(ulong)local_30);
      iVar6 = pvVar5->rule;
      std::
      vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
      ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                    *)(in_RSI + 0x58),(long)iVar6);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_ffffffffffffffc0,
                 (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      uVar1 = isLLRule((CycleBreaking<covenant::Sym> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                       (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
      if ((bool)uVar1) {
        bVar2 = isRLRule((CycleBreaking<covenant::Sym> *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                         (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                         in_stack_ffffffffffffffb0,
                         (set<int,_std::less<int>,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (bVar2) {
          iVar6 = 0;
        }
        else {
          local_1 = 0;
          iVar6 = 1;
        }
      }
      else {
        local_1 = 0;
        iVar6 = 1;
      }
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff80));
      if (iVar6 != 0) goto LAB_00232489;
      local_30 = local_30 + 1;
      in_stack_ffffffffffffffa0 = 0;
    }
  }
  local_1 = 1;
LAB_00232489:
  return (bool)(local_1 & 1);
}

Assistant:

bool isLinearSCC (const CFG &g, 
                    const vector<int> &group, 
                    const set<int>    &group_set)
  {
    for ( unsigned int vv = 0; vv < group.size(); vv++ )
    {
      for ( unsigned int ri = 0; ri < g.prods[vv].size(); ri++ )
      {
        int r = g.prods[vv][ri].rule;
        vector<EdgeSym> RHS = g.rules[r];
        if (!isLLRule(g, vv, RHS, group_set)) return false;
        if (!isRLRule(g, vv, RHS, group_set)) return false;
      }
    }
    // here all rules are either left-linear or right-linear.
    return true;
  }